

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall
ki::dml::Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
set_value(Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,FieldBase *other)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  char *pcVar5;
  value_error *this_00;
  string sStack_1d8;
  string local_1b8 [32];
  ostringstream oss;
  
  bVar1 = FieldBase::is_type<std::__cxx11::string>(other);
  if (bVar1) {
    lVar3 = __dynamic_cast(other,&FieldBase::typeinfo,&Field<std::__cxx11::string>::typeinfo,0);
    std::__cxx11::string::string(local_1b8,(string *)(lVar3 + 0x38));
    std::__cxx11::string::_M_assign((string *)&this->m_value);
    std::__cxx11::string::~string(local_1b8);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Tried to copy value from ");
  iVar2 = (*(other->super_Serializable)._vptr_Serializable[5])(other);
  poVar4 = std::operator<<(poVar4,(char *)CONCAT44(extraout_var,iVar2));
  poVar4 = std::operator<<(poVar4," field to ");
  pcVar5 = get_type_name(this);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4," field.");
  this_00 = (value_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_00,&sStack_1d8);
  __cxa_throw(this_00,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_value(FieldBase *other) final
		{
			if (other->is_type<ValueT>())
			{
				auto *real_other = dynamic_cast<Field<ValueT> *>(other);
				set_value(real_other->get_value());
			}
			else
			{
				std::ostringstream oss;
				oss << "Tried to copy value from " <<
					other->get_type_name() << " field to " <<
					get_type_name() << " field.";
				throw value_error(oss.str());
			}
		}